

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void new_handler_terminate(void)

{
  LogFlags in_stack_00000030;
  int in_stack_0000003c;
  ConstevalFormatString<0U> in_stack_00000078;
  undefined1 in_stack_00000080 [16];
  undefined1 in_stack_00000090 [16];
  Level in_stack_00000170;
  char *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  
  std::set_new_handler(std::terminate);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  LogPrintFormatInternal<>
            ((string_view)in_stack_00000090,(string_view)in_stack_00000080,in_stack_0000003c,
             in_stack_00000030,in_stack_00000170,in_stack_00000078);
  std::terminate();
}

Assistant:

[[noreturn]] static void new_handler_terminate()
{
    // Rather than throwing std::bad-alloc if allocation fails, terminate
    // immediately to (try to) avoid chain corruption.
    // Since logging may itself allocate memory, set the handler directly
    // to terminate first.
    std::set_new_handler(std::terminate);
    LogError("Out of memory. Terminating.\n");

    // The log was successful, terminate now.
    std::terminate();
}